

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_first_byte,bool want_earliest_match,
          bool run_forward)

{
  size_t sVar1;
  byte bVar2;
  size_type sVar3;
  const_pointer pcVar4;
  bool bVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  void *pvVar9;
  State *pSVar10;
  State *pSVar11;
  int *__dest;
  undefined7 in_register_00000011;
  byte *pbVar12;
  State *pSVar13;
  size_t sVar14;
  undefined3 in_register_00000081;
  bool bVar15;
  uint c;
  State *state;
  ulong uVar16;
  StateSaver save_start;
  StateSaver save_s;
  byte *local_258;
  byte *local_250;
  byte *local_248;
  int *local_230;
  StateSaver local_220;
  undefined4 local_1f4;
  byte *local_1f0;
  ulong local_1e8;
  Prog *local_1e0;
  StateSaver local_1d8;
  LogMessage local_1b0;
  
  local_1f4 = (undefined4)CONCAT71(in_register_00000011,have_first_byte);
  local_250 = (byte *)(params->text).data_;
  sVar3 = (params->text).size_;
  local_1f0 = local_250 + sVar3;
  pbVar7 = local_250;
  pbVar12 = local_1f0;
  if (CONCAT31(in_register_00000081,run_forward) != 0) {
    pbVar7 = local_1f0;
    pbVar12 = local_250;
  }
  pSVar11 = params->start;
  local_1e0 = this->prog_;
  if ((pSVar11->flag_ & 0x100) == 0) {
    bVar15 = false;
    local_248 = (byte *)0x0;
LAB_001b9ca9:
    if (sVar3 != 0) {
      local_1e8 = -(ulong)run_forward | 1;
      local_258 = (byte *)0x0;
      pSVar13 = pSVar11;
      state = pSVar11;
      pbVar8 = pbVar12;
      do {
        if (((char)local_1f4 == '\0') || (state != pSVar13)) {
          if (!run_forward) goto LAB_001b9d3f;
LAB_001b9d16:
          pbVar12 = pbVar8 + 1;
        }
        else {
          if (run_forward) {
            pbVar8 = (byte *)memchr(pbVar8,params->first_byte,(long)pbVar7 - (long)pbVar8);
            pbVar12 = local_1f0;
            if (pbVar8 != (byte *)0x0) goto LAB_001b9d16;
            goto LAB_001ba058;
          }
          pvVar9 = memrchr(local_250,params->first_byte,(long)pbVar8 - (long)pbVar7);
          if (pvVar9 == (void *)0x0) goto LAB_001ba073;
          pbVar8 = (byte *)((long)pvVar9 + 1);
LAB_001b9d3f:
          pbVar8 = pbVar8 + -1;
          pbVar12 = pbVar8;
        }
        bVar2 = *pbVar8;
        pSVar11 = (State *)(&state[1].inst_)[local_1e0->bytemap_[bVar2]];
        pSVar10 = pSVar13;
        if (pSVar11 == (State *)0x0) {
          pSVar11 = RunStateOnByteUnlocked(this,state,(uint)bVar2);
          if (pSVar11 == (State *)0x0) {
            if (((dfa_should_bail_when_slow == '\x01') && (local_258 != (byte *)0x0)) &&
               (((ulong)((long)pbVar12 - (long)local_258) <
                 (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
              params->failed = true;
              return false;
            }
            if (pSVar13 < (State *)0x3) {
              local_220.inst_ = (int *)0x0;
              local_220.ninst_ = 0;
              local_220.flag_ = 0;
              local_220.is_special_ = true;
              local_258 = (byte *)0x0;
              local_220.dfa_ = this;
              local_220.special_ = pSVar13;
            }
            else {
              local_220.is_special_ = false;
              local_220.special_ = (State *)0x0;
              local_220.ninst_ = pSVar13->ninst_;
              local_220.flag_ = pSVar13->flag_;
              sVar1 = (long)pSVar13->ninst_ * 4;
              sVar14 = sVar1;
              if ((long)pSVar13->ninst_ < 0) {
                sVar14 = 0xffffffffffffffff;
              }
              local_220.dfa_ = this;
              local_258 = (byte *)operator_new__(sVar14);
              local_220.inst_ = (int *)local_258;
              memmove(local_258,pSVar13->inst_,sVar1);
            }
            local_1d8.dfa_ = this;
            if (state < (State *)0x3) {
              local_1d8.inst_ = (int *)0x0;
              local_1d8.ninst_ = 0;
              local_1d8.flag_ = 0;
              local_1d8.is_special_ = true;
              local_230 = (int *)0x0;
              local_1d8.special_ = state;
            }
            else {
              local_1d8.is_special_ = false;
              local_1d8.special_ = (State *)0x0;
              local_1d8.ninst_ = state->ninst_;
              local_1d8.flag_ = state->flag_;
              sVar1 = (long)state->ninst_ * 4;
              sVar14 = sVar1;
              if ((long)state->ninst_ < 0) {
                sVar14 = 0xffffffffffffffff;
              }
              local_230 = (int *)operator_new__(sVar14);
              local_1d8.inst_ = local_230;
              memmove(local_230,state->inst_,sVar1);
            }
            ResetCache(this,params->cache_lock);
            pSVar10 = StateSaver::Restore(&local_220);
            if ((pSVar10 == (State *)0x0) ||
               (pSVar11 = StateSaver::Restore(&local_1d8), pSVar11 == (State *)0x0)) {
LAB_001b9fef:
              params->failed = true;
              bVar5 = false;
              pSVar11 = (State *)0x0;
            }
            else {
              pSVar11 = RunStateOnByteUnlocked(this,pSVar11,(uint)bVar2);
              if (pSVar11 == (State *)0x0) {
                LogMessage::LogMessage
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                           ,0x5ad);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0.str_,
                           "RunStateOnByteUnlocked failed after ResetCache",0x2e);
                LogMessage::~LogMessage(&local_1b0);
                goto LAB_001b9fef;
              }
              bVar5 = true;
            }
            if (((State *)0x2 < state) && (local_230 != (int *)0x0)) {
              operator_delete__(local_230);
            }
            if (((State *)0x2 < pSVar13) && (local_258 != (byte *)0x0)) {
              operator_delete__(local_258);
            }
            local_258 = pbVar12;
            if (!bVar5) {
              return false;
            }
          }
        }
        if (pSVar11 < (State *)0x3) {
          pbVar8 = pbVar7;
          if (pSVar11 == (State *)0x1) {
            params->ep = (char *)local_248;
            return bVar15;
          }
          goto LAB_001ba28e;
        }
        if ((pSVar11->flag_ & 0x100) != 0) {
          if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
             (0 < (long)pSVar11->ninst_)) {
            uVar16 = (long)pSVar11->ninst_ + 1;
            do {
              if (pSVar11->inst_[uVar16 - 2] == -2) break;
              SparseSetT<void>::InsertInternal(params->matches,true,pSVar11->inst_[uVar16 - 2]);
              uVar16 = uVar16 - 1;
            } while (1 < uVar16);
          }
          local_248 = pbVar12 + local_1e8;
          bVar15 = true;
          pbVar8 = local_248;
          if (want_earliest_match) goto LAB_001ba28e;
        }
        pSVar13 = pSVar10;
        state = pSVar11;
        pbVar8 = pbVar12;
      } while (pbVar12 != pbVar7);
    }
    state = pSVar11;
    local_250 = pbVar12;
    if (run_forward) {
LAB_001ba058:
      pbVar8 = (byte *)((params->text).data_ + (params->text).size_);
      local_250 = pbVar12;
      if (pbVar8 == (byte *)((params->context).data_ + (params->context).size_)) goto LAB_001ba095;
LAB_001ba07f:
      c = (uint)*pbVar8;
      uVar6 = (uint)this->prog_->bytemap_[*pbVar8];
    }
    else {
LAB_001ba073:
      pcVar4 = (params->text).data_;
      if (pcVar4 != (params->context).data_) {
        pbVar8 = (byte *)(pcVar4 + -1);
        goto LAB_001ba07f;
      }
LAB_001ba095:
      uVar6 = this->prog_->bytemap_range_;
      c = 0x100;
    }
    pSVar11 = (State *)(&state[1].inst_)[(int)uVar6];
    if ((pSVar11 == (State *)0x0) &&
       (pSVar11 = RunStateOnByteUnlocked(this,state,c), pSVar11 == (State *)0x0)) {
      if (state < (State *)0x3) {
        local_220.inst_ = (int *)0x0;
        local_220.ninst_ = 0;
        local_220.flag_ = 0;
        local_220.is_special_ = true;
        __dest = (int *)0x0;
        local_220.dfa_ = this;
        local_220.special_ = state;
      }
      else {
        local_220.is_special_ = false;
        local_220.special_ = (State *)0x0;
        local_220.ninst_ = state->ninst_;
        local_220.flag_ = state->flag_;
        sVar1 = (long)state->ninst_ * 4;
        uVar16 = 0xffffffffffffffff;
        if (-1 < (long)state->ninst_) {
          uVar16 = sVar1;
        }
        local_220.dfa_ = this;
        __dest = (int *)operator_new__(uVar16);
        local_220.inst_ = __dest;
        memmove(__dest,state->inst_,sVar1);
      }
      ResetCache(this,params->cache_lock);
      pSVar11 = StateSaver::Restore(&local_220);
      if (pSVar11 == (State *)0x0) {
LAB_001ba1f1:
        params->failed = true;
        bVar5 = false;
        pSVar11 = (State *)0x0;
      }
      else {
        pSVar11 = RunStateOnByteUnlocked(this,pSVar11,c);
        if (pSVar11 == (State *)0x0) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                     ,0x5f6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"RunStateOnByteUnlocked failed after Reset",0x29);
          LogMessage::~LogMessage(&local_1b0);
          goto LAB_001ba1f1;
        }
        bVar5 = true;
      }
      if (((State *)0x2 < state) && (__dest != (int *)0x0)) {
        operator_delete__(__dest);
      }
      if (!bVar5) {
        return false;
      }
    }
    if (pSVar11 < (State *)0x3) {
      pbVar8 = pbVar7;
      if (pSVar11 != (State *)0x1) {
LAB_001ba28e:
        params->ep = (char *)pbVar8;
        goto LAB_001ba292;
      }
    }
    else if (((((pSVar11->flag_ & 0x100) != 0) &&
              (bVar15 = true, local_248 = local_250, params->matches != (SparseSet *)0x0)) &&
             (this->kind_ == kManyMatch)) && (0 < (long)pSVar11->ninst_)) {
      uVar16 = (long)pSVar11->ninst_ + 1;
      do {
        if (pSVar11->inst_[uVar16 - 2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar11->inst_[uVar16 - 2]);
        uVar16 = uVar16 - 1;
      } while (1 < uVar16);
    }
    params->ep = (char *)local_248;
  }
  else {
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar11->ninst_)) {
      uVar16 = (long)pSVar11->ninst_ + 1;
      do {
        if (pSVar11->inst_[uVar16 - 2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar11->inst_[uVar16 - 2]);
        uVar16 = uVar16 - 1;
      } while (1 < uVar16);
    }
    bVar15 = true;
    local_248 = pbVar12;
    if (!want_earliest_match) goto LAB_001b9ca9;
    params->ep = (char *)pbVar12;
LAB_001ba292:
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_first_byte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;
  if (ExtraDebug)
    fprintf(stderr, "@stx: %s\n", DumpState(s).c_str());

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @stx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (ExtraDebug)
      fprintf(stderr, "@%td: %s\n",
              p - bp, DumpState(s).c_str());

    if (have_first_byte && s == start) {
      // In start state, only way out is to find first_byte,
      // so use optimized assembly in memchr to skip ahead.
      // If first_byte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->first_byte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->first_byte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (ExtraDebug)
        fprintf(stderr, "match @%td! [%s]\n",
                lastmatch - bp, DumpState(s).c_str());
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  if (ExtraDebug)
    fprintf(stderr, "@etx: %s\n", DumpState(s).c_str());

  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @etx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}